

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense.hpp
# Opt level: O0

void __thiscall
remora::dense_matrix_adaptor<double_const,remora::row_major,remora::cpu_tag,remora::cpu_tag>::
dense_matrix_adaptor<double,remora::cpu_tag>
          (dense_matrix_adaptor<const_double,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>
           *this,dense_matrix_adaptor<double,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>
                 *expression)

{
  size_type sVar1;
  dense_matrix_adaptor<double,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag> *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI->m_values;
  sVar1 = dense_matrix_adaptor<double,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>::size1
                    (in_RSI);
  in_RDI[1] = sVar1;
  sVar1 = dense_matrix_adaptor<double,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>::size2
                    (in_RSI);
  in_RDI[2] = sVar1;
  in_RDI[3] = in_RSI->m_leading_dimension;
  return;
}

Assistant:

dense_matrix_adaptor(dense_matrix_adaptor<U, Orientation, TagU, cpu_tag> const& expression)
	: m_values(expression.m_values)
	, m_size1(expression.size1())
	, m_size2(expression.size2())
	, m_leading_dimension(expression.m_leading_dimension)
	{static_assert(std::is_convertible<TagU,Tag>::value, "Can not convert storage type of argument to the given Tag");}